

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O3

bool __thiscall
cmRuntimeDependencyArchive::IsPostExcluded(cmRuntimeDependencyArchive *this,string *name)

{
  pointer pRVar1;
  bool bVar2;
  RegularExpression *regex;
  pointer pRVar3;
  RegularExpressionMatch match;
  RegularExpressionMatch local_d0;
  
  local_d0.startp[0] = (char *)0x0;
  local_d0.endp[0] = (char *)0x0;
  local_d0.searchstring = (char *)0x0;
  pRVar3 = (this->PostIncludeRegexes).
           super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (this->PostIncludeRegexes).
           super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pRVar3 != pRVar1) {
    do {
      bVar2 = cmsys::RegularExpression::find(pRVar3,(name->_M_dataplus)._M_p,&local_d0);
      if (bVar2) goto LAB_0037f914;
      pRVar3 = pRVar3 + 1;
    } while (pRVar3 != pRVar1);
  }
  pRVar3 = (this->PostExcludeRegexes).
           super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (this->PostExcludeRegexes).
           super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pRVar3 == pRVar1) {
LAB_0037f914:
    bVar2 = false;
  }
  else {
    do {
      bVar2 = cmsys::RegularExpression::find(pRVar3,(name->_M_dataplus)._M_p,&local_d0);
      if (bVar2) {
        return bVar2;
      }
      pRVar3 = pRVar3 + 1;
    } while (pRVar3 != pRVar1);
  }
  return bVar2;
}

Assistant:

bool cmRuntimeDependencyArchive::IsPostExcluded(const std::string& name)
{
  cmsys::RegularExpressionMatch match;

  for (auto const& regex : this->PostIncludeRegexes) {
    if (regex.find(name.c_str(), match)) {
      return false;
    }
  }

  for (auto const& regex : this->PostExcludeRegexes) {
    if (regex.find(name.c_str(), match)) {
      return true;
    }
  }

  return false;
}